

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

xmlChar * xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt)

{
  byte bVar1;
  byte *pbVar2;
  xmlChar *pxVar3;
  uint uVar4;
  byte bVar5;
  int error;
  byte *pbVar6;
  bool bVar7;
  
  pbVar2 = ctxt->cur;
  pbVar6 = pbVar2;
  if (*pbVar2 == 0x27) {
LAB_001ea118:
    do {
      pbVar6 = pbVar6 + 1;
      ctxt->cur = pbVar6;
      bVar1 = *pbVar6;
      uVar4 = (uint)bVar1;
      bVar5 = bVar1 - 9;
      do {
        if (bVar1 < 0x20) {
          if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_001ea140;
          goto LAB_001ea118;
        }
      } while (uVar4 == 0);
    } while (uVar4 != 0x27);
  }
  else {
    if (*pbVar2 != 0x22) {
      error = 3;
      goto LAB_001ea17e;
    }
LAB_001ea0e5:
    do {
      pbVar6 = pbVar6 + 1;
      ctxt->cur = pbVar6;
      bVar1 = *pbVar6;
      uVar4 = (uint)bVar1;
      bVar5 = bVar1 - 9;
      do {
        if (bVar1 < 0x20) {
          if ((0xd < uVar4) || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_001ea140;
          goto LAB_001ea0e5;
        }
      } while (uVar4 == 0);
      bVar7 = uVar4 != 0x22;
      uVar4 = (uint)bVar1;
    } while (bVar7);
  }
LAB_001ea140:
  if ((bVar5 < 2) || (0x1f < (byte)uVar4 || uVar4 == 0xd)) {
    pxVar3 = xmlStrndup(pbVar2 + 1,(int)pbVar6 - (int)(pbVar2 + 1));
    if (*ctxt->cur == '\0') {
      return pxVar3;
    }
    ctxt->cur = ctxt->cur + 1;
    return pxVar3;
  }
  error = 2;
LAB_001ea17e:
  xmlXPathErr(ctxt,error);
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt) {
    const xmlChar *q;
    xmlChar *ret = NULL;

    if (CUR == '"') {
        NEXT;
	q = CUR_PTR;
	while ((IS_CHAR_CH(CUR)) && (CUR != '"'))
	    NEXT;
	if (!IS_CHAR_CH(CUR)) {
	    XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
	} else {
	    ret = xmlStrndup(q, CUR_PTR - q);
	    NEXT;
        }
    } else if (CUR == '\'') {
        NEXT;
	q = CUR_PTR;
	while ((IS_CHAR_CH(CUR)) && (CUR != '\''))
	    NEXT;
	if (!IS_CHAR_CH(CUR)) {
	    XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
	} else {
	    ret = xmlStrndup(q, CUR_PTR - q);
	    NEXT;
        }
    } else {
	XP_ERRORNULL(XPATH_START_LITERAL_ERROR);
    }
    return(ret);
}